

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::renameRedefinedComponents
          (TraverseSchema *this,DOMElement *redefineElem,SchemaInfo *redefiningSchemaInfo,
          SchemaInfo *redefinedSchemaInfo)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  XMLCh *chars;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  XMLStringPool *pXVar3;
  MemoryManager *pMVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  DOMNode *node;
  undefined4 extraout_var;
  short *psVar8;
  XMLCh *chars_00;
  XMLSize_t XVar9;
  undefined4 extraout_var_00;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *this_02;
  undefined4 extraout_var_01;
  short *psVar10;
  short *key1;
  
  node = &XUtil::getFirstChildElement(&redefineElem->super_DOMNode)->super_DOMNode;
  if (node != (DOMNode *)0x0) {
    this_00 = &this->fBuffer;
    do {
      iVar6 = (*node->_vptr_DOMNode[0x18])(node);
      key1 = (short *)CONCAT44(extraout_var,iVar6);
      if (key1 != &SchemaSymbols::fgELT_ANNOTATION) {
        psVar8 = &SchemaSymbols::fgELT_ANNOTATION;
        psVar10 = key1;
        if (key1 == (short *)0x0) {
LAB_00321735:
          if (*psVar8 == 0) goto LAB_003218e7;
        }
        else {
          do {
            sVar1 = *psVar10;
            if (sVar1 == 0) goto LAB_00321735;
            sVar2 = *psVar8;
            psVar8 = psVar8 + 1;
            psVar10 = psVar10 + 1;
          } while (sVar1 == sVar2);
        }
        chars_00 = getElementAttValue(this,(DOMElement *)node,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                      NCName);
        chars = this->fTargetNSURIString;
        (this->fBuffer).fIndex = 0;
        if ((chars == (XMLCh *)0x0) || (*chars == L'\0')) {
          XVar9 = 0;
        }
        else {
          XMLBuffer::append(this_00,chars);
          XVar9 = this_00->fIndex;
        }
        if (XVar9 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar9 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar9 + 1;
        (this->fBuffer).fBuffer[XVar9] = L',';
        XMLBuffer::append(this_00,chars_00);
        this_01 = this->fRedefineComponents;
        pXVar3 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
        bVar5 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                          (this_01,key1,iVar6);
        if (!bVar5) {
          pXVar3 = this->fStringPool;
          uVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,key1);
          iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar7);
          bVar5 = validateRedefineNameChange
                            (this,(DOMElement *)node,(XMLCh *)CONCAT44(extraout_var_00,iVar6),
                             chars_00,1,redefiningSchemaInfo);
          if (bVar5) {
            fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo,
                               (XMLCh *)CONCAT44(extraout_var_00,iVar6),chars_00,1);
          }
          else {
            this_02 = redefiningSchemaInfo->fFailedRedefineList;
            if (this_02 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
              this_02 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
                        XMemory::operator_new(0x28,redefiningSchemaInfo->fMemoryManager);
              pMVar4 = redefiningSchemaInfo->fMemoryManager;
              this_02->fCallDestructor = false;
              this_02->fCurCount = 0;
              this_02->fMaxCount = 4;
              this_02->fElemList = (DOMElement **)0x0;
              this_02->fMemoryManager = pMVar4;
              iVar6 = (*pMVar4->_vptr_MemoryManager[3])();
              this_02->fElemList = (DOMElement **)CONCAT44(extraout_var_01,iVar6);
              memset((DOMElement **)CONCAT44(extraout_var_01,iVar6),0,this_02->fMaxCount << 3);
              redefiningSchemaInfo->fFailedRedefineList = this_02;
            }
            ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(this_02,1);
            XVar9 = this_02->fCurCount;
            this_02->fCurCount = XVar9 + 1;
            this_02->fElemList[XVar9] = (DOMElement *)node;
          }
        }
      }
LAB_003218e7:
      node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
    } while (node != (DOMNode *)0x0);
  }
  return;
}

Assistant:

void TraverseSchema::renameRedefinedComponents(const DOMElement* const redefineElem,
                                               SchemaInfo* const redefiningSchemaInfo,
                                               SchemaInfo* const redefinedSchemaInfo) {

    DOMElement* child = XUtil::getFirstChildElement(redefineElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        // if component already redefined skip
        const XMLCh* typeName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(typeName);

        if (fRedefineComponents->containsKey(childName, fStringPool->addOrFind(fBuffer.getRawBuffer()))) {
            continue;
        }

        // Rename
        const XMLCh* tmpChildName = fStringPool->getValueForId(fStringPool->addOrFind(childName));

        if (validateRedefineNameChange(child, tmpChildName, typeName, 1, redefiningSchemaInfo)) {
            fixRedefinedSchema(child, redefinedSchemaInfo, tmpChildName, typeName, 1);
        }
        else {
            redefiningSchemaInfo->addFailedRedefine(child);
        }
    }
}